

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scantoken.cpp
# Opt level: O3

void __thiscall YAML::Scanner::ScanDocEnd(Scanner *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  undefined8 uVar3;
  Token local_78;
  
  PopAllIndents(this);
  PopAllSimpleKeys(this);
  this->m_simpleKeyAllowed = false;
  this->m_canBeJSONFlow = false;
  uVar3._0_4_ = (this->INPUT).m_mark.pos;
  uVar3._4_4_ = (this->INPUT).m_mark.line;
  iVar2 = (this->INPUT).m_mark.column;
  YAML::Stream::eat(&this->INPUT,3);
  paVar1 = &local_78.value.field_2;
  local_78.status = VALID;
  local_78.type = DOC_END;
  local_78.value._M_string_length = 0;
  local_78.value.field_2._M_local_buf[0] = '\0';
  local_78.params.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.params.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
  local_78.params.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
  local_78.params.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  local_78._76_8_ = 0;
  local_78.mark._0_8_ = uVar3;
  local_78.mark.column = iVar2;
  local_78.value._M_dataplus._M_p = (pointer)paVar1;
  std::deque<YAML::Token,_std::allocator<YAML::Token>_>::emplace_back<YAML::Token>
            (&(this->m_tokens).c,&local_78);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_78.params);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.value._M_dataplus._M_p != paVar1) {
    operator_delete(local_78.value._M_dataplus._M_p);
  }
  return;
}

Assistant:

void Scanner::ScanDocEnd() {
  PopAllIndents();
  PopAllSimpleKeys();
  m_simpleKeyAllowed = false;
  m_canBeJSONFlow = false;

  // eat
  Mark mark = INPUT.mark();
  INPUT.eat(3);
  m_tokens.push(Token(Token::DOC_END, mark));
}